

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O2

void __thiscall QStyleOptionMenuItem::QStyleOptionMenuItem(QStyleOptionMenuItem *this,int version)

{
  QStyleOption::QStyleOption(&this->super_QStyleOption,version,4);
  this->menuItemType = Normal;
  this->checkType = NotCheckable;
  this->checked = false;
  this->menuHasCheckableItems = true;
  (this->menuRect).x1 = 0;
  (this->menuRect).y1 = 0;
  (this->menuRect).x2 = -1;
  (this->menuRect).y2 = -1;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  QIcon::QIcon(&this->icon);
  this->maxIconWidth = 0;
  this->reservedShortcutWidth = 0;
  QFont::QFont(&this->font);
  return;
}

Assistant:

QStyleOptionMenuItem::QStyleOptionMenuItem(int version)
    : QStyleOption(version, SO_MenuItem), menuItemType(Normal),
      checkType(NotCheckable), checked(false), menuHasCheckableItems(true), maxIconWidth(0),
      reservedShortcutWidth(0)
{
}